

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::DoubletonEquationPS::execute
          (DoubletonEquationPS *this,VectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *param_3,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  double dVar1;
  char cVar2;
  VarStatus VVar3;
  uint uVar4;
  int iVar5;
  Nonzero<double> *pNVar6;
  pointer pdVar7;
  VarStatus *pVVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double local_38;
  
  VVar3 = cStatus->data[this->m_k];
  if (VVar3 == ON_UPPER) {
    cVar2 = this->m_strictUp;
  }
  else {
    if (VVar3 == FIXED) {
      dVar11 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[this->m_j];
      if (this->m_maxSense != true) {
        if ((dVar11 <= 0.0) || (this->m_strictLo == false)) {
          if (0.0 <= dVar11) {
            return;
          }
          if (this->m_strictUp != true) {
            return;
          }
        }
        goto LAB_001c01d4;
      }
      if ((0.0 < dVar11) && (this->m_strictUp != false)) goto LAB_001c01d4;
      if (0.0 <= dVar11) {
        return;
      }
    }
    else if (VVar3 != ON_LOWER) {
      return;
    }
    cVar2 = this->m_strictLo;
  }
  if (cVar2 == '\0') {
    return;
  }
LAB_001c01d4:
  local_38 = this->m_kObj;
  dVar11 = SVectorBase<double>::operator[](&(this->m_col).super_SVectorBase<double>,this->m_i);
  uVar4 = (this->m_col).super_SVectorBase<double>.memused;
  pNVar6 = (this->m_col).super_SVectorBase<double>.m_elem;
  pdVar7 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = 0;
  uVar9 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar9 = uVar10;
  }
  for (; uVar9 * 0x10 != uVar10; uVar10 = uVar10 + 0x10) {
    iVar5 = *(int *)((long)&pNVar6->idx + uVar10);
    if (iVar5 != this->m_i) {
      local_38 = local_38 - *(double *)((long)&pNVar6->val + uVar10) * pdVar7[iVar5];
    }
  }
  pdVar7[this->m_i] = local_38 / dVar11;
  pdVar7 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7[this->m_k] = 0.0;
  dVar11 = this->m_jObj - (local_38 * this->m_aij) / dVar11;
  iVar5 = this->m_j;
  pdVar7[iVar5] = dVar11;
  if (this->m_jFixed == false) {
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    if ((extraout_XMM0_Qa < dVar11) ||
       ((dVar11 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[this->m_j],
        (*(this->super_PostStep)._vptr_PostStep[7])(this), ABS(dVar11) <= extraout_XMM0_Qa_00 &&
        (dVar11 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[this->m_j], dVar1 = this->m_Lo_j,
        (*(this->super_PostStep)._vptr_PostStep[7])(this),
        ABS(dVar11 - dVar1) <= extraout_XMM0_Qa_01)))) {
      pVVar8 = cStatus->data;
      pVVar8[this->m_j] = ON_LOWER;
    }
    else {
      pVVar8 = cStatus->data;
      pVVar8[this->m_j] = ON_UPPER;
    }
  }
  else {
    pVVar8 = cStatus->data;
    pVVar8[iVar5] = FIXED;
  }
  pVVar8[this->m_k] = BASIC;
  return;
}

Assistant:

void SPxMainSM<R>::DoubletonEquationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // dual:
   if((cStatus[m_k]  != SPxSolverBase<R>::BASIC) &&
         ((cStatus[m_k] == SPxSolverBase<R>::ON_LOWER && m_strictLo) ||
          (cStatus[m_k] == SPxSolverBase<R>::ON_UPPER && m_strictUp) ||
          (cStatus[m_k] == SPxSolverBase<R>::FIXED    &&
           ((m_maxSense && ((r[m_j] > 0 && m_strictUp) || (r[m_j] < 0 && m_strictLo))) ||
            (!m_maxSense && ((r[m_j] > 0 && m_strictLo) || (r[m_j] < 0 && m_strictUp)))))))
   {
      R val  = m_kObj;
      R aik  = m_col[m_i];

      for(int _k = 0; _k < m_col.size(); ++_k)
      {
         if(m_col.index(_k) != m_i)
            val -= m_col.value(_k) * y[m_col.index(_k)];
      }

      y[m_i] = val / aik;
      r[m_k] = 0.0;

      r[m_j] = m_jObj - val * m_aij / aik;

      SOPLEX_ASSERT_WARN("WMAISM73", isNotZero(m_aij * aik, this->epsilon()));

      // basis:
      if(m_jFixed)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else
      {
         if(GT(r[m_j], (R) 0, this->epsilon()) || (isZero(r[m_j], this->epsilon())
               && EQ(x[m_j], m_Lo_j, this->epsilon())))
            cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
         else
            cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }

      cStatus[m_k] = SPxSolverBase<R>::BASIC;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM23 Dimension doesn't match after this step.");
   }

#endif
}